

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode hsts_create(hsts *h,char *hostname,_Bool subdomains,curl_off_t expires)

{
  size_t sVar1;
  void *ne;
  void *pvVar2;
  size_t length;
  CURLcode CVar3;
  
  sVar1 = strlen(hostname);
  CVar3 = CURLE_OK;
  if (sVar1 == 0) {
    length = 0;
  }
  else {
    length = sVar1 - (hostname[sVar1 - 1] == '.');
  }
  if (length != 0) {
    ne = (*Curl_ccalloc)(1,0x30);
    CVar3 = CURLE_OUT_OF_MEMORY;
    if (ne != (void *)0x0) {
      pvVar2 = Curl_memdup0(hostname,length);
      if (pvVar2 == (void *)0x0) {
        (*Curl_cfree)(ne);
      }
      else {
        *(void **)((long)ne + 0x18) = pvVar2;
        *(curl_off_t *)((long)ne + 0x28) = expires;
        *(_Bool *)((long)ne + 0x20) = subdomains;
        Curl_llist_insert_next(&h->list,(h->list).tail,ne,(Curl_llist_element *)ne);
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode hsts_create(struct hsts *h,
                            const char *hostname,
                            bool subdomains,
                            curl_off_t expires)
{
  size_t hlen;
  DEBUGASSERT(h);
  DEBUGASSERT(hostname);

  hlen = strlen(hostname);
  if(hlen && (hostname[hlen - 1] == '.'))
    /* strip off any trailing dot */
    --hlen;
  if(hlen) {
    char *duphost;
    struct stsentry *sts = hsts_entry();
    if(!sts)
      return CURLE_OUT_OF_MEMORY;

    duphost = Curl_memdup0(hostname, hlen);
    if(!duphost) {
      free(sts);
      return CURLE_OUT_OF_MEMORY;
    }

    sts->host = duphost;
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
    Curl_llist_insert_next(&h->list, h->list.tail, sts, &sts->node);
  }
  return CURLE_OK;
}